

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::~RandomizerWorld(RandomizerWorld *this)

{
  pointer ppIVar1;
  WorldNode *this_00;
  pointer ppWVar2;
  WorldPath *this_01;
  pointer ppWVar3;
  WorldRegion *this_02;
  pointer ppHVar4;
  HintSource *this_03;
  SpawnLocation *this_04;
  pointer ppVar5;
  WorldTeleportTree *this_05;
  pointer ppIVar6;
  Item *this_06;
  _Base_ptr p_Var7;
  pointer ppWVar8;
  pointer ppWVar9;
  type *tree_1;
  pointer ppVar10;
  pointer ppIVar11;
  pointer ppIVar12;
  pointer ppHVar13;
  WorldTeleportTree *this_07;
  
  ppIVar1 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar12 = (this->_item_sources).
                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppIVar12 != ppIVar1; ppIVar12 = ppIVar12 + 1) {
    if (*ppIVar12 != (ItemSource *)0x0) {
      (*(*ppIVar12)->_vptr_ItemSource[1])();
    }
  }
  for (p_Var7 = (this->_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    this_00 = *(WorldNode **)(p_Var7 + 2);
    if (this_00 != (WorldNode *)0x0) {
      WorldNode::~WorldNode(this_00);
    }
    operator_delete(this_00,0xa8);
  }
  ppWVar2 = (this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppWVar8 = (this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppWVar8 != ppWVar2; ppWVar8 = ppWVar8 + 1
      ) {
    this_01 = *ppWVar8;
    if (this_01 != (WorldPath *)0x0) {
      WorldPath::~WorldPath(this_01);
    }
    operator_delete(this_01,0x60);
  }
  ppWVar3 = (this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar9 = (this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppWVar9 != ppWVar3; ppWVar9 = ppWVar9 + 1
      ) {
    this_02 = *ppWVar9;
    if (this_02 != (WorldRegion *)0x0) {
      WorldRegion::~WorldRegion(this_02);
    }
    operator_delete(this_02,0x78);
  }
  ppHVar4 = (this->_hint_sources).super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppHVar13 = (this->_hint_sources).
                  super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppHVar13 != ppHVar4; ppHVar13 = ppHVar13 + 1) {
    this_03 = *ppHVar13;
    if (this_03 != (HintSource *)0x0) {
      HintSource::~HintSource(this_03);
    }
    operator_delete(this_03,0x90);
  }
  for (p_Var7 = (this->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var7 !=
      &(this->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    this_04 = *(SpawnLocation **)(p_Var7 + 2);
    if (this_04 != (SpawnLocation *)0x0) {
      SpawnLocation::~SpawnLocation(this_04);
    }
    operator_delete(this_04,0x50);
  }
  ppVar5 = (this->_teleport_tree_pairs).
           super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (this->_teleport_tree_pairs).
                 super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar5; ppVar10 = ppVar10 + 1
      ) {
    this_07 = ppVar10->first;
    this_05 = ppVar10->second;
    if (this_07 != this_05) {
      if (this_05 != (WorldTeleportTree *)0x0) {
        WorldTeleportTree::~WorldTeleportTree(this_05);
      }
      operator_delete(this_05,0x58);
      this_07 = ppVar10->first;
    }
    if (this_07 != (WorldTeleportTree *)0x0) {
      WorldTeleportTree::~WorldTeleportTree(this_07);
    }
    operator_delete(this_07,0x58);
  }
  ppIVar6 = (this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar11 = (this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar11 != ppIVar6;
      ppIVar11 = ppIVar11 + 1) {
    this_06 = *ppIVar11;
    if (this_06 != (Item *)0x0) {
      Item::~Item(this_06);
    }
    operator_delete(this_06,0x40);
  }
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
            (&(this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>);
  std::
  _Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
  ::~_Vector_base(&(this->_teleport_tree_pairs).
                   super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
                 );
  std::
  _Rb_tree<Entity_*,_std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->_custom_dialogues)._M_t);
  std::_Vector_base<EntityType_*,_std::allocator<EntityType_*>_>::~_Vector_base
            (&(this->_fahl_enemies).super__Vector_base<EntityType_*,_std::allocator<EntityType_*>_>)
  ;
  std::_Vector_base<HintSource_*,_std::allocator<HintSource_*>_>::~_Vector_base
            (&(this->_used_hint_sources).
              super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>);
  std::_Vector_base<HintSource_*,_std::allocator<HintSource_*>_>::~_Vector_base
            (&(this->_hint_sources).super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
  ::~_Rb_tree(&(this->_available_spawn_locations)._M_t);
  std::_Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>::~_Vector_base
            (&(this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>);
  std::_Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>::~_Vector_base
            (&(this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  ::~_Rb_tree(&(this->_nodes)._M_t);
  std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base
            (&(this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>)
  ;
  World::~World(&this->super_World);
  return;
}

Assistant:

RandomizerWorld::~RandomizerWorld()
{
    for (ItemSource* source : _item_sources)
        delete source;
    for (auto& [key, node] : _nodes)
        delete node;
    for (WorldPath* path : _paths)
        delete path;
    for (WorldRegion* region : _regions)
        delete region;
    for (HintSource* hint_source : _hint_sources)
        delete hint_source;
    for (auto& [key, spawn_loc] : _available_spawn_locations)
        delete spawn_loc;
    for (auto& [tree_1, tree_2] : _teleport_tree_pairs)
    {
        if(tree_1 != tree_2)
            delete tree_2;
        delete tree_1;
    }
    for(Item* item : _archipelago_items)
        delete item;
}